

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O3

word Shr_ManComputeTruth6_rec(Gia_Man_t *p,int iNode,Vec_Wrd_t *vTruths)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  word wVar4;
  word wVar5;
  
  if (p->nTravIdsAlloc <= iNode) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iNode] == p->nTravIds) {
    if ((iNode < 0) || (vTruths->nSize <= iNode)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    wVar4 = vTruths->pArray[(uint)iNode];
  }
  else {
    p->pTravIds[iNode] = p->nTravIds;
    if ((iNode < 0) || (p->nObjs <= iNode)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar3 = (uint)*(undefined8 *)(p->pObjs + (uint)iNode);
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink6.c"
                    ,0x145,"word Shr_ManComputeTruth6_rec(Gia_Man_t *, int, Vec_Wrd_t *)");
    }
    pGVar1 = p->pObjs + (uint)iNode;
    wVar4 = Shr_ManComputeTruth6_rec(p,iNode - (uVar3 & 0x1fffffff),vTruths);
    pGVar2 = p->pObjs;
    if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    wVar5 = Shr_ManComputeTruth6_rec
                      (p,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 -
                         (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vTruths);
    if (vTruths->nSize <= iNode) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
    }
    wVar4 = ((*(long *)pGVar1 << 2) >> 0x3f ^ wVar5) & ((*(long *)pGVar1 << 0x22) >> 0x3f ^ wVar4);
    vTruths->pArray[(uint)iNode] = wVar4;
  }
  return wVar4;
}

Assistant:

word Shr_ManComputeTruth6_rec( Gia_Man_t * p, int iNode, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;
    if ( Gia_ObjIsTravIdCurrentId(p, iNode) )
        return Vec_WrdEntry(vTruths, iNode);
    Gia_ObjSetTravIdCurrentId(p, iNode);
    pObj = Gia_ManObj( p, iNode );
    assert( Gia_ObjIsAnd(pObj) );
    Truth0 = Shr_ManComputeTruth6_rec( p, Gia_ObjFaninId0p(p, pObj), vTruths );
    Truth1 = Shr_ManComputeTruth6_rec( p, Gia_ObjFaninId1p(p, pObj), vTruths );
    if ( Gia_ObjFaninC0(pObj) )
        Truth0 = ~Truth0;
    if ( Gia_ObjFaninC1(pObj) )
        Truth1 = ~Truth1;
    Vec_WrdWriteEntry( vTruths, iNode, Truth0 & Truth1 );
    return Truth0 & Truth1;
}